

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_2x2(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte *pbVar9;
  uint in_EDX;
  long *in_RSI;
  int *in_RDI;
  JSAMPROW elemptr;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  
  memset(in_RDI,0,0x100);
  pbVar9 = (byte *)(*in_RSI + (ulong)in_EDX);
  bVar1 = *pbVar9;
  bVar2 = pbVar9[1];
  bVar3 = *pbVar9;
  bVar4 = pbVar9[1];
  pbVar9 = (byte *)(in_RSI[1] + (ulong)in_EDX);
  bVar5 = *pbVar9;
  bVar6 = pbVar9[1];
  bVar7 = *pbVar9;
  bVar8 = pbVar9[1];
  *in_RDI = ((uint)bVar1 + (uint)bVar2 + (uint)bVar5 + (uint)bVar6 + -0x200) * 0x10;
  in_RDI[8] = (((uint)bVar1 + (uint)bVar2) - ((uint)bVar5 + (uint)bVar6)) * 0x10;
  in_RDI[1] = (((uint)bVar3 - (uint)bVar4) + ((uint)bVar7 - (uint)bVar8)) * 0x10;
  in_RDI[9] = (((uint)bVar3 - (uint)bVar4) - ((uint)bVar7 - (uint)bVar8)) * 0x10;
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_2x2 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  JSAMPROW elemptr;

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT. */

  /* Row 0 */
  elemptr = sample_data[0] + start_col;

  tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[1]);
  tmp1 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[1]);

  /* Row 1 */
  elemptr = sample_data[1] + start_col;

  tmp2 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[1]);
  tmp3 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[1]);

  /* Pass 2: process columns.
   * We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/2)**2 = 2**4.
   */

  /* Column 0 */
  /* Apply unsigned->signed conversion */
  data[DCTSIZE*0] = (DCTELEM) ((tmp0 + tmp2 - 4 * CENTERJSAMPLE) << 4);
  data[DCTSIZE*1] = (DCTELEM) ((tmp0 - tmp2) << 4);

  /* Column 1 */
  data[DCTSIZE*0+1] = (DCTELEM) ((tmp1 + tmp3) << 4);
  data[DCTSIZE*1+1] = (DCTELEM) ((tmp1 - tmp3) << 4);
}